

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eliminate_dead_output_stores_pass.cpp
# Opt level: O2

Status __thiscall
spvtools::opt::EliminateDeadOutputStoresPass::DoDeadOutputStoreElimination
          (EliminateDeadOutputStoresPass *this)

{
  Module *pMVar1;
  Instruction *this_00;
  pointer ppIVar2;
  bool bVar3;
  code cVar4;
  ExecutionModel EVar5;
  Status SVar6;
  uint32_t uVar7;
  int iVar8;
  uint32_t id;
  DefUseManager *this_01;
  TypeManager *this_02;
  DecorationManager *this_03;
  Type *pTVar9;
  undefined4 extraout_var;
  long lVar10;
  long *plVar11;
  Instruction *var;
  Instruction **kinst;
  pointer ppIVar12;
  _Any_data local_50;
  code *local_40;
  code *local_38;
  
  EVar5 = IRContext::GetStage((this->super_Pass).context_);
  SVar6 = Failure;
  if (EVar5 < ExecutionModelFragment) {
    ppIVar12 = (this->kill_list_).
               super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
               ._M_impl.super__Vector_impl_data._M_start;
    if ((this->kill_list_).
        super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
        ._M_impl.super__Vector_impl_data._M_finish != ppIVar12) {
      (this->kill_list_).
      super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
      ._M_impl.super__Vector_impl_data._M_finish = ppIVar12;
    }
    this_01 = IRContext::get_def_use_mgr((this->super_Pass).context_);
    this_02 = IRContext::get_type_mgr((this->super_Pass).context_);
    this_03 = IRContext::get_decoration_mgr((this->super_Pass).context_);
    pMVar1 = (((this->super_Pass).context_)->module_)._M_t.
             super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
             ._M_t.
             super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
             .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl;
    this_00 = &(pMVar1->types_values_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_;
    while (this_00 = *(Instruction **)((long)this_00 + 8),
          this_00 !=
          &(pMVar1->types_values_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_) {
      if (this_00->opcode_ == OpVariable) {
        uVar7 = Instruction::type_id(this_00);
        pTVar9 = analysis::TypeManager::GetType(this_02,uVar7);
        iVar8 = (*pTVar9->_vptr_Type[0x21])(pTVar9);
        if (*(int *)(CONCAT44(extraout_var,iVar8) + 0x30) == 3) {
          uVar7 = Instruction::result_id(this_00);
          bVar3 = analysis::DecorationManager::HasDecoration(this_03,uVar7,0xb);
          cVar4 = (code)0x1;
          if (!bVar3) {
            plVar11 = *(long **)(CONCAT44(extraout_var,iVar8) + 0x28);
            lVar10 = (**(code **)(*plVar11 + 0xc0))(plVar11);
            if (lVar10 != 0) {
              plVar11 = *(long **)(lVar10 + 0x28);
            }
            pTVar9 = (Type *)(**(code **)(*plVar11 + 0xf0))(plVar11);
            if (pTVar9 == (Type *)0x0) {
              cVar4 = (code)0x0;
            }
            else {
              id = analysis::TypeManager::GetId(this_02,pTVar9);
              cVar4 = (code)analysis::DecorationManager::HasDecoration(this_03,id,0xb);
            }
          }
          local_50._8_8_ = 0;
          local_50._M_unused._M_object = ::operator_new(0x18);
          *(EliminateDeadOutputStoresPass **)local_50._M_unused._0_8_ = this;
          *(Instruction **)((long)local_50._M_unused._0_8_ + 8) = this_00;
          *(code *)((long)local_50._M_unused._0_8_ + 0x10) = cVar4;
          local_38 = std::
                     _Function_handler<void_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/eliminate_dead_output_stores_pass.cpp:222:17)>
                     ::_M_invoke;
          local_40 = std::
                     _Function_handler<void_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/eliminate_dead_output_stores_pass.cpp:222:17)>
                     ::_M_manager;
          analysis::DefUseManager::ForEachUser
                    (this_01,uVar7,(function<void_(spvtools::opt::Instruction_*)> *)&local_50);
          if (local_40 != (code *)0x0) {
            (*local_40)(&local_50,&local_50,__destroy_functor);
          }
        }
      }
    }
    ppIVar2 = (this->kill_list_).
              super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    for (ppIVar12 = (this->kill_list_).
                    super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                    ._M_impl.super__Vector_impl_data._M_start; ppIVar12 != ppIVar2;
        ppIVar12 = ppIVar12 + 1) {
      IRContext::KillInst((this->super_Pass).context_,*ppIVar12);
    }
    SVar6 = (this->kill_list_).
            super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
            ._M_impl.super__Vector_impl_data._M_start ==
            (this->kill_list_).
            super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
            ._M_impl.super__Vector_impl_data._M_finish | SuccessWithChange;
  }
  return SVar6;
}

Assistant:

Pass::Status EliminateDeadOutputStoresPass::DoDeadOutputStoreElimination() {
  // Current implementation only supports vert, tesc, tese, geom shaders
  auto stage = context()->GetStage();
  if (stage != spv::ExecutionModel::Vertex &&
      stage != spv::ExecutionModel::TessellationControl &&
      stage != spv::ExecutionModel::TessellationEvaluation &&
      stage != spv::ExecutionModel::Geometry)
    return Status::Failure;
  InitializeElimination();
  analysis::DefUseManager* def_use_mgr = context()->get_def_use_mgr();
  analysis::TypeManager* type_mgr = context()->get_type_mgr();
  analysis::DecorationManager* deco_mgr = context()->get_decoration_mgr();
  // Process all output variables
  for (auto& var : context()->types_values()) {
    if (var.opcode() != spv::Op::OpVariable) {
      continue;
    }
    analysis::Type* var_type = type_mgr->GetType(var.type_id());
    analysis::Pointer* ptr_type = var_type->AsPointer();
    if (ptr_type->storage_class() != spv::StorageClass::Output) {
      continue;
    }
    // If builtin decoration on variable, process as builtin.
    auto var_id = var.result_id();
    bool is_builtin = false;
    if (deco_mgr->HasDecoration(var_id, uint32_t(spv::Decoration::BuiltIn))) {
      is_builtin = true;
    } else {
      // If interface block with builtin members, process as builtin.
      // Strip off outer array type if present.
      auto curr_type = ptr_type->pointee_type();
      auto arr_type = curr_type->AsArray();
      if (arr_type) curr_type = arr_type->element_type();
      auto str_type = curr_type->AsStruct();
      if (str_type) {
        auto str_type_id = type_mgr->GetId(str_type);
        if (deco_mgr->HasDecoration(str_type_id,
                                    uint32_t(spv::Decoration::BuiltIn)))
          is_builtin = true;
      }
    }
    // For each store or access chain using var, if dead builtin or all its
    // locations are dead, kill store or all access chain's stores
    def_use_mgr->ForEachUser(
        var_id, [this, &var, is_builtin](Instruction* user) {
          auto op = user->opcode();
          if (op == spv::Op::OpEntryPoint || op == spv::Op::OpName ||
              op == spv::Op::OpDecorate || user->IsNonSemanticInstruction())
            return;
          if (is_builtin)
            KillAllDeadStoresOfBuiltinRef(user, &var);
          else
            KillAllDeadStoresOfLocRef(user, &var);
        });
  }
  for (auto& kinst : kill_list_) context()->KillInst(kinst);

  return kill_list_.empty() ? Status::SuccessWithoutChange
                            : Status::SuccessWithChange;
}